

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

wchar_t * __thiscall ON_Font::FontFaceName(ON_Font *this)

{
  bool bVar1;
  wchar_t *local_20;
  ON_Font *this_local;
  
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_windows_logfont_name);
  if (bVar1) {
    local_20 = ON_wString::operator_cast_to_wchar_t_(&this->m_loc_windows_logfont_name);
  }
  else {
    local_20 = ON_wString::operator_cast_to_wchar_t_(&this->m_en_windows_logfont_name);
  }
  return local_20;
}

Assistant:

const wchar_t* ON_Font::FontFaceName() const
{
  // Was never a "real" face name. 
  // Always returned a value from or used in a Windows GDI LOGFONT.lfFaceName[].
  return
    m_loc_windows_logfont_name.IsNotEmpty()
    ? static_cast<const wchar_t*>(m_loc_windows_logfont_name)
    : static_cast<const wchar_t*>(m_en_windows_logfont_name);
}